

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemFinalize(Mem *pMem,FuncDef *pFunc)

{
  undefined1 local_90 [8];
  Mem t;
  sqlite3_context ctx;
  int rc;
  FuncDef *pFunc_local;
  Mem *pMem_local;
  
  ctx.argv[0]._4_4_ = 0;
  if ((pFunc != (FuncDef *)0x0) && (pFunc->xFinalize != (_func_void_sqlite3_context_ptr *)0x0)) {
    memset(&t.xDel,0,0x38);
    memset(local_90,0,0x38);
    t.u.i._0_2_ = 1;
    t._32_8_ = pMem->db;
    t.xDel = (_func_void_void_ptr *)local_90;
    (*pFunc->xFinalize)((sqlite3_context *)&t.xDel);
    if (0 < pMem->szMalloc) {
      sqlite3DbFree(pMem->db,pMem->zMalloc);
    }
    memcpy(pMem,local_90,0x38);
    ctx.argv[0]._4_4_ = ctx.pVdbe._4_4_;
  }
  return ctx.argv[0]._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFinalize(Mem *pMem, FuncDef *pFunc){
  int rc = SQLITE_OK;
  if( ALWAYS(pFunc && pFunc->xFinalize) ){
    sqlite3_context ctx;
    Mem t;
    assert( (pMem->flags & MEM_Null)!=0 || pFunc==pMem->u.pDef );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    memset(&ctx, 0, sizeof(ctx));
    memset(&t, 0, sizeof(t));
    t.flags = MEM_Null;
    t.db = pMem->db;
    ctx.pOut = &t;
    ctx.pMem = pMem;
    ctx.pFunc = pFunc;
    pFunc->xFinalize(&ctx); /* IMP: R-24505-23230 */
    assert( (pMem->flags & MEM_Dyn)==0 );
    if( pMem->szMalloc>0 ) sqlite3DbFree(pMem->db, pMem->zMalloc);
    memcpy(pMem, &t, sizeof(t));
    rc = ctx.isError;
  }
  return rc;
}